

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O0

int output_bin(char *fname,int length)

{
  FILE *__stream;
  int local_2c;
  int cc;
  FILE *fp;
  int length_local;
  char *fname_local;
  
  __stream = fopen(fname,"wb");
  if (__stream == (FILE *)0x0) {
    fname_local._4_4_ = 0;
  }
  else {
    for (local_2c = 0; local_2c < length; local_2c = local_2c + 1) {
      fputc((uint)ebuf[local_2c],__stream);
    }
    fclose(__stream);
    fname_local._4_4_ = 1;
  }
  return fname_local._4_4_;
}

Assistant:

int output_bin(char *fname, int length)
{
   FILE *fp;
 
   int cc;

   fp = fopen(fname, "wb");
   if(fp == NULL) 
      return 0;
   for (cc = 0 ; cc < length ; cc++)
      fputc( ebuf[cc], fp);
   fclose(fp);
   
   return 1;
}